

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

iterator __thiscall CP::list<int>::erase(list<int> *this,iterator it)

{
  node *pnVar1;
  node *pnVar2;
  
  pnVar1 = (it.ptr)->prev;
  pnVar2 = (it.ptr)->next;
  pnVar1->next = pnVar2;
  pnVar2->prev = pnVar1;
  operator_delete(it.ptr,0x18);
  this->mSize = this->mSize - 1;
  return (iterator)pnVar2;
}

Assistant:

iterator erase(iterator it) {
      iterator tmp(it.ptr->next);
      it.ptr->prev->next = it.ptr->next;
      it.ptr->next->prev = it.ptr->prev;
      delete it.ptr;
      mSize--;
      return tmp;
    }